

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall
Lib::
Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
::expand(Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
         *this)

{
  int iVar1;
  Entry *array;
  void *placement;
  Entry *pEVar2;
  int iVar3;
  Entry *pEVar4;
  bool bVar5;
  
  iVar1 = this->_capacity;
  iVar3 = 0x20;
  if ((long)iVar1 != 0) {
    iVar3 = iVar1 * 2;
  }
  this->_capacity = iVar3;
  array = this->_entries;
  placement = Lib::alloc((long)iVar3 * 0x2c);
  pEVar2 = array_new<Lib::Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>::Entry>
                     (placement,(long)this->_capacity);
  this->_entries = pEVar2;
  this->_afterLast = pEVar2 + this->_capacity;
  this->_maxEntries = (int)((double)this->_capacity * 0.8);
  iVar3 = this->_noOfEntries;
  this->_noOfEntries = 0;
  pEVar2 = array;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    do {
      pEVar4 = pEVar2;
      pEVar2 = pEVar4 + 1;
    } while (pEVar4->code == 0);
    insert(this,(Variable *)&(pEVar4->_key).__align,
           (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)&(pEVar4->_value).__align,
           pEVar4->code);
  }
  if (array != (Entry *)0x0) {
    array_delete<Lib::Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>::Entry>
              (array,(long)iVar1);
    Lib::free(array);
    return;
  }
  return;
}

Assistant:

void expand()
  {
    size_t oldCapacity = _capacity;
    _capacity = _capacity ? _capacity * 2 : 32;

    Entry* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(sizeof(Entry)*_capacity,"Map<>");
    _entries = array_new<Entry>(mem, _capacity);

    _afterLast = _entries + _capacity;
    _maxEntries = (int)(_capacity * 0.8);
    // experiments using (a) random numbers (b) consecutive numbers
    // and (1) int->int 20M allocations (2) string->int 10M allocations
    // and 30,000,000 allocations
    // 0.6 : 6.80 4.87 20.8 14.9 32.6 14
    // 0.7 : 6.58 5.61 23.1 15.2 35.2 16.6
    // 0.8 : 6.36 5.77 24.0 15.4 36.0 17.4
    // 0.9 : 7.54 6.04 25.4 15.2 37.0 18.4
    // copy old entries
    Entry* current = oldEntries;
    int remaining = _noOfEntries;
    _noOfEntries = 0;
    while (remaining != 0) {
      // find first occupied entry
      while (! current->occupied()) {
        current ++;
      }
      // now current is occupied
      insert(std::move(current->key()),std::move(current->value()),current->code);
      current ++;
      remaining --;
    }
    if (oldEntries) {
      array_delete(oldEntries, oldCapacity);
      DEALLOC_KNOWN(oldEntries,sizeof(Entry)*oldCapacity,"Map<>");
    }
  }